

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int standardize_path(char *fullpath,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int *in_RSI;
  char *in_RDI;
  char cwd [1025];
  char tmpPath [1025];
  char local_838 [32];
  int *in_stack_fffffffffffff7e8;
  char *in_stack_fffffffffffff7f0;
  char *in_stack_fffffffffffff7f8;
  int *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  int *in_stack_fffffffffffffbd0;
  char in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbd9;
  int in_stack_fffffffffffffbe4;
  char *in_stack_fffffffffffffbe8;
  int local_4;
  
  iVar1 = fits_path2url(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                        (char *)CONCAT71(in_stack_fffffffffffffbd9,in_stack_fffffffffffffbd8),
                        in_stack_fffffffffffffbd0);
  if (iVar1 == 0) {
    if (in_stack_fffffffffffffbd8 != '/') {
      fits_get_cwd(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
      sVar2 = strlen(local_838);
      sVar3 = strlen(&stack0xfffffffffffffbd8);
      if (0x400 < sVar2 + sVar3 + 1) {
        ffpmsg((char *)0x1126f6);
        *in_RSI = 0x68;
        return 0x68;
      }
      strcat(local_838,"/");
      strcat(local_838,&stack0xfffffffffffffbd8);
      fits_clean_url(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
    }
    strcpy(in_RDI,&stack0xfffffffffffffbd8);
    local_4 = *in_RSI;
  }
  else {
    local_4 = *in_RSI;
  }
  return local_4;
}

Assistant:

int standardize_path(char *fullpath, int* status)
{
   /* Utility function for common operation in fits_already_open 
      fullpath:  I/O string to be standardized. Assume len = FLEN_FILENAME */
    
   char tmpPath[FLEN_FILENAME];
   char cwd [FLEN_FILENAME];
    
   if (fits_path2url(fullpath, FLEN_FILENAME, tmpPath, status))
      return(*status);
   
   if (tmpPath[0] != '/')
   {
      fits_get_cwd(cwd,status);
      if (strlen(cwd) + strlen(tmpPath) + 1 > FLEN_FILENAME-1) {
	    ffpmsg("Tile name is too long. (standardize_path)");
            return(*status = FILE_NOT_OPENED);
      }
      strcat(cwd,"/");
      strcat(cwd,tmpPath);
      fits_clean_url(cwd,tmpPath,status);
   }
   
   strcpy(fullpath, tmpPath);
      
   return (*status);
}